

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Char16Test.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  undefined8 uVar5;
  long *plVar6;
  long *plVar7;
  char16_t *pcVar8;
  ostream *poVar9;
  int iVar10;
  char *__assertion;
  allocator<char16_t> local_49;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_48;
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  plVar2 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  if (plVar2 == (long *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Requested DOM implementation is not supported");
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar10 = 4;
LAB_00102544:
    xercesc_4_0::XMLPlatformUtils::Terminate();
    return iVar10;
  }
  plVar2 = (long *)(**(code **)(*plVar2 + 0x40))
                             (plVar2,L"https://example.com/schema/char16",L"catalogue",0,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*plVar2 + 0x68))(plVar2);
  plVar4 = (long *)(**(code **)(*plVar2 + 0x80))
                             (plVar2,L"https://example.com/schema/char16",L"produit");
  (**(code **)(*plVar3 + 0x88))(plVar3,plVar4);
  uVar5 = (**(code **)(*plVar2 + 0x28))(plVar2,L"Xerces-C");
  (**(code **)(*plVar4 + 0x88))(plVar4,uVar5);
  plVar6 = (long *)(**(code **)(*plVar2 + 0x80))
                             (plVar2,L"https://example.com/schema/char16",L"catégorie");
  (**(code **)(*plVar3 + 0x88))(plVar3,plVar6);
  (**(code **)(*plVar6 + 0x160))(plVar6,L"idée",L"génial");
  uVar5 = (**(code **)(*plVar2 + 0x28))(plVar2,L"produit");
  (**(code **)(*plVar6 + 0x88))(plVar6,uVar5);
  plVar7 = (long *)(**(code **)(*plVar2 + 0x80))
                             (plVar2,L"https://example.com/schema/char16",L"développéPar");
  (**(code **)(*plVar3 + 0x88))(plVar3,plVar7);
  uVar5 = (**(code **)(*plVar2 + 0x28))(plVar2,L"Fondation du logiciel Apache");
  (**(code **)(*plVar7 + 0x88))(plVar7,uVar5);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&local_48,L"produit",&local_49);
  pcVar8 = (char16_t *)(**(code **)(*plVar4 + 0x140))(plVar4);
  bVar1 = std::operator==(&local_48,pcVar8);
  if (bVar1) {
    std::__cxx11::u16string::~u16string((u16string *)&local_48);
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_48,L"catégorie",&local_49);
    pcVar8 = (char16_t *)(**(code **)(*plVar6 + 0x140))(plVar6);
    bVar1 = std::operator==(&local_48,pcVar8);
    if (bVar1) {
      std::__cxx11::u16string::~u16string((u16string *)&local_48);
      std::__cxx11::u16string::u16string<std::allocator<char16_t>>
                ((u16string *)&local_48,L"génial",&local_49);
      pcVar8 = (char16_t *)(**(code **)(*plVar6 + 0x148))(plVar6,L"idée");
      bVar1 = std::operator==(&local_48,pcVar8);
      if (bVar1) {
        std::__cxx11::u16string::~u16string((u16string *)&local_48);
        std::__cxx11::u16string::u16string<std::allocator<char16_t>>
                  ((u16string *)&local_48,L"développéPar",&local_49);
        pcVar8 = (char16_t *)(**(code **)(*plVar7 + 0x140))(plVar7);
        bVar1 = std::operator==(&local_48,pcVar8);
        if (bVar1) {
          std::__cxx11::u16string::~u16string((u16string *)&local_48);
          iVar10 = 0;
          goto LAB_00102544;
        }
        __assertion = anon_var_dwarf_23c6;
        __line = 0x5b;
      }
      else {
        __assertion = anon_var_dwarf_23b0;
        __line = 0x5a;
      }
    }
    else {
      __assertion = anon_var_dwarf_239a;
      __line = 0x59;
    }
  }
  else {
    __assertion = "std::u16string(u\"produit\") == prodElem->getTagName()";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
    try
    {
        xercesc::XMLPlatformUtils::Initialize();
    }
    catch (const xercesc::XMLException& toCatch)
    {
      std::cerr << "Error during initialization of xerces-c: "
                << toCatch.getMessage()
                << std::endl;
        return 1;
    }

    const char16_t *ns = u"https://example.com/schema/char16";

    int errorCode = 0;

    xercesc::DOMImplementation* impl = xercesc::DOMImplementationRegistry::getDOMImplementation(u"LS");
    if(impl)
    {
        try
        {
            xercesc::DOMDocument* doc = impl->createDocument
                (ns, // root element namespace URI.
                 u"catalogue", // root element name
                 nullptr);

            xercesc::DOMElement* rootElem = doc->getDocumentElement();

            xercesc::DOMElement*  prodElem = doc->createElementNS(ns, u"produit");
            rootElem->appendChild(prodElem);

            xercesc::DOMText*    prodDataVal = doc->createTextNode(u"Xerces-C");
            prodElem->appendChild(prodDataVal);

            xercesc::DOMElement*  catElem = doc->createElementNS(ns, u"catégorie");
            rootElem->appendChild(catElem);

            catElem->setAttribute(u"idée", u"génial");

            xercesc::DOMText*    catDataVal = doc->createTextNode(u"produit");
            catElem->appendChild(catDataVal);

            xercesc::DOMElement*  devByElem = doc->createElementNS(ns, u"développéPar");
            rootElem->appendChild(devByElem);

            xercesc::DOMText*    devByDataVal = doc->createTextNode(u"Fondation du logiciel Apache");
            devByElem->appendChild(devByDataVal);

            assert(std::u16string(u"produit") == prodElem->getTagName());
            assert(std::u16string(u"catégorie") == catElem->getTagName());
            assert(std::u16string(u"génial") == catElem->getAttribute(u"idée"));
            assert(std::u16string(u"développéPar") == devByElem->getTagName());
        }
        catch (const xercesc::OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCode = 5;
        }
        catch (const xercesc::DOMException& e)
        {
            std::cerr << "DOMException code is:  " << e.code << std::endl;
            errorCode = 2;
        }
        catch (...)
        {
            std::cerr << "An error occurred creating the document" << std::endl;
            errorCode = 3;
        }
    }
    else
    {
        std::cerr << "Requested DOM implementation is not supported" << std::endl;
        errorCode = 4;
    }

    xercesc::XMLPlatformUtils::Terminate();
    return errorCode;
}